

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O2

bool __thiscall lzham::search_accelerator::find_all_matches(search_accelerator *this,uint num_bytes)

{
  byte bVar1;
  uchar *puVar2;
  uchar *puVar3;
  uint uVar4;
  bool bVar5;
  void *pData_ptr;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  bVar5 = vector<lzham::dict_match>::try_resize_no_construct
                    (&this->m_matches,this->m_max_probes * num_bytes,false);
  if (bVar5) {
    bVar5 = vector<long>::try_resize_no_construct(&this->m_match_refs,num_bytes,false);
    if (bVar5) {
      memset((this->m_match_refs).m_p,0xff,(ulong)((this->m_match_refs).m_size << 3));
      this->m_fill_lookahead_pos = this->m_lookahead_pos;
      this->m_fill_lookahead_size = num_bytes;
      this->m_fill_dict_size = this->m_cur_dict_size;
      this->m_next_match_ref = 0;
      if (this->m_pTask_pool == (task_pool *)0x0) {
        find_all_matches_callback(this,0,pData_ptr);
        this->m_num_completed_helper_threads = 0;
LAB_0010f49e:
        bVar5 = find_len2_matches(this);
        return bVar5;
      }
      bVar5 = vector<unsigned_char>::try_resize_no_construct
                        (&this->m_hash_thread_index,0x10000,false);
      if (bVar5) {
        memset((this->m_hash_thread_index).m_p,0xff,(ulong)(this->m_hash_thread_index).m_size);
        if (2 < num_bytes) {
          puVar2 = (this->m_dict).m_p;
          uVar6 = (ulong)(this->m_max_dict_size_mask & this->m_lookahead_pos);
          uVar4 = 2;
          if (2 < (int)num_bytes) {
            uVar4 = num_bytes;
          }
          uVar9 = 0;
          uVar11 = (uint)puVar2[uVar6 + 1];
          uVar10 = (uint)puVar2[uVar6];
          for (lVar7 = 2; uVar8 = uVar11, uVar4 != (uint)lVar7; lVar7 = lVar7 + 1) {
            bVar1 = puVar2[lVar7 + uVar6];
            uVar11 = (uint)bVar1 << 4 ^ (uVar8 << 8 | uVar10);
            puVar3 = (this->m_hash_thread_index).m_p;
            if (puVar3[uVar11] == 0xff) {
              puVar3[uVar11] = (uchar)uVar9;
              uVar9 = uVar9 + 1;
              if (uVar9 == this->m_max_helper_threads) {
                uVar9 = 0;
              }
            }
            uVar11 = (uint)bVar1;
            uVar10 = uVar8;
          }
        }
        this->m_num_completed_helper_threads = 0;
        bVar5 = task_pool::
                queue_multiple_object_tasks<lzham::search_accelerator,void(lzham::search_accelerator::*)(unsigned_long_long,void*)>
                          (this->m_pTask_pool,this,
                           (offset_in_search_accelerator_to_subr)find_all_matches_callback,0,0,
                           (void *)(ulong)this->m_max_helper_threads);
        if (bVar5) goto LAB_0010f49e;
      }
    }
  }
  return false;
}

Assistant:

bool search_accelerator::find_all_matches(uint num_bytes)
   {
      if (!m_matches.try_resize_no_construct(m_max_probes * num_bytes))
         return false;

      if (!m_match_refs.try_resize_no_construct(num_bytes))
         return false;

      memset(m_match_refs.get_ptr(), 0xFF, m_match_refs.size_in_bytes());

      m_fill_lookahead_pos = m_lookahead_pos;
      m_fill_lookahead_size = num_bytes;
      m_fill_dict_size = m_cur_dict_size;

      m_next_match_ref = 0;

      if (!m_pTask_pool)
      {
         find_all_matches_callback(0, NULL);
         
         m_num_completed_helper_threads = 0;
      }
      else
      {
         if (!m_hash_thread_index.try_resize_no_construct(0x10000))
            return false;

         memset(m_hash_thread_index.get_ptr(), 0xFF, m_hash_thread_index.size_in_bytes());

         uint next_thread_index = 0;
         const uint8* pDict = &m_dict[m_lookahead_pos & m_max_dict_size_mask];
         uint num_unique_digrams = 0;

         if (num_bytes >= 3)
         {
            uint c0 = pDict[0];
            uint c1 = pDict[1];

            const int limit = ((int)num_bytes - 2);
            for (int i = 0; i < limit; i++)
            {
               uint c2 = pDict[2];
               uint t = hash3_to_16(c0, c1, c2);
               c0 = c1;
               c1 = c2;

               pDict++;

               if (m_hash_thread_index[t] == UINT8_MAX)
               {
                  num_unique_digrams++;

                  m_hash_thread_index[t] = static_cast<uint8>(next_thread_index);
                  if (++next_thread_index == m_max_helper_threads)
                        next_thread_index = 0;
               }
            }
         }
         
         m_num_completed_helper_threads = 0;

         if (!m_pTask_pool->queue_multiple_object_tasks(this, &search_accelerator::find_all_matches_callback, 0, m_max_helper_threads))
            return false;
      }

      return find_len2_matches();
   }